

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::updateCursorBlinking(QWidgetLineControl *this)

{
  long lVar1;
  bool bVar2;
  Duration in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000L>_> flashTime;
  QRect *in_stack_ffffffffffffff78;
  QWidgetLineControl *in_stack_ffffffffffffff80;
  QWidgetLineControl *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  if (((*(ushort *)(in_RDI.__r + 0x50) >> 10 & 1) != 0) &&
     ((*(ushort *)(in_RDI.__r + 0x50) >> 2 & 1) == 0)) {
    QGuiApplication::styleHints();
    QStyleHints::cursorFlashTime();
    ms<(char)49>();
    std::chrono::operator*
              ((int *)in_stack_ffffffffffffff78,(duration<long,_std::ratio<1L,_1000L>_> *)0x5e0d24);
    ms<(char)50>();
    bVar2 = std::chrono::operator>=
                      ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff80,
                       (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff78);
    if (bVar2) {
      in_stack_ffffffffffffff80 = (QWidgetLineControl *)(in_RDI.__r + 0x54);
      std::chrono::operator/
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff80,
                 (int *)in_stack_ffffffffffffff78);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff80,
                 (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff78);
      QBasicTimer::start((QBasicTimer *)in_stack_ffffffffffffff78,in_RDI,(QObject *)0x5e0d95);
    }
  }
  *(ushort *)(in_RDI.__r + 0x50) = *(ushort *)(in_RDI.__r + 0x50) & 0xfdff | 0x200;
  inputMask(in_stack_ffffffffffffff98);
  bVar2 = QString::isEmpty((QString *)0x5e0dc0);
  if (bVar2) {
    cursorRect((QWidgetLineControl *)0x5e0dd0);
  }
  else {
    QRect::QRect((QRect *)in_stack_ffffffffffffff80);
  }
  updateNeeded(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QString::~QString((QString *)0x5e0dff);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::updateCursorBlinking()
{
    m_blinkTimer.stop();

    if (m_blinkEnabled && !m_readOnly) {
        const auto flashTime = QGuiApplication::styleHints()->cursorFlashTime() * 1ms;
        if (flashTime >= 2ms)
            m_blinkTimer.start(flashTime / 2, this);
    }

    m_blinkStatus = 1;
    emit updateNeeded(inputMask().isEmpty() ? cursorRect() : QRect());
}